

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
               (CodedInputStream *input,double *value)

{
  double *pdVar1;
  bool bVar2;
  double local_10;
  
  pdVar1 = (double *)input->buffer_;
  if (*(int *)&input->buffer_end_ - (int)pdVar1 < 8) {
    bVar2 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_10);
    if (!bVar2) {
      return false;
    }
  }
  else {
    local_10 = *pdVar1;
    input->buffer_ = (uint8_t *)(pdVar1 + 1);
  }
  *value = local_10;
  return true;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<double, WireFormatLite::TYPE_DOUBLE>(
    io::CodedInputStream* input, double* value) {
  uint64_t temp;
  if (!input->ReadLittleEndian64(&temp)) return false;
  *value = DecodeDouble(temp);
  return true;
}